

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O0

void __thiscall
jhu::thrax::AlignedSentencePair::AlignedSentencePair
          (AlignedSentencePair *this,Sentence *s,Sentence *t,Alignment *a)

{
  bool bVar1;
  out_of_range *this_00;
  Alignment *a_local;
  Sentence *t_local;
  Sentence *s_local;
  AlignedSentencePair *this_local;
  
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&this->src,s);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&this->tgt,t);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::vector(&this->alignment,a);
  bVar1 = consistent(this);
  if (!bVar1) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"inconsistent aligned sentence pair");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  return;
}

Assistant:

AlignedSentencePair(Sentence s, Sentence t, Alignment a)
      : src(std::move(s)), tgt(std::move(t)), alignment(std::move(a)) {
    if (!consistent()) {
      throw std::out_of_range("inconsistent aligned sentence pair");
    }
  }